

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libmeshb7.c
# Opt level: O2

int GmfCpyLin(int64_t InpIdx,int64_t OutIdx,int KwdCod)

{
  long lVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  float *wrd;
  double *wrd_00;
  char *__format;
  char *pcVar6;
  FILE *pFVar7;
  ulong uVar8;
  double dVar9;
  int a;
  float f;
  __jmp_buf_tag *local_158;
  int64_t l;
  double d;
  long local_140;
  char s [256];
  
  iVar3 = _setjmp((__jmp_buf_tag *)(InpIdx + 0x48));
  iVar4 = 0;
  if (iVar3 == 0) {
    local_140 = (long)KwdCod;
    lVar1 = InpIdx + local_140 * 0x3300;
    local_158 = (__jmp_buf_tag *)(InpIdx + 0x48);
    for (uVar8 = 0; (long)uVar8 < (long)*(int *)(lVar1 + 0x11c); uVar8 = uVar8 + 1) {
      cVar2 = *(char *)(lVar1 + 0x10e8 + uVar8);
      if (cVar2 == 'c') {
        memset(s,0,0x100);
        if ((*(byte *)(InpIdx + 0xc) & 1) == 0) {
          sVar5 = fread(s,4,0x40,*(FILE **)(InpIdx + 0x300410));
          if (sVar5 != 0x40) {
            iVar4 = -3;
            goto LAB_00109236;
          }
        }
        else {
          iVar4 = __isoc99_fscanf(*(FILE **)(InpIdx + 0x300410),"%s",s);
          if (iVar4 != 1) goto LAB_00109230;
        }
        pFVar7 = *(FILE **)(OutIdx + 0x300410);
        if ((*(byte *)(OutIdx + 0xc) & 1) == 0) {
          fwrite(s,4,0x40,pFVar7);
        }
        else {
          __format = "%s ";
          pcVar6 = s;
LAB_001091cb:
          fprintf(pFVar7,__format,pcVar6);
        }
      }
      else if (cVar2 == 'i') {
        if (*(int *)(InpIdx + 4) < 4) {
          if ((*(uint *)(InpIdx + 0xc) & 1) == 0) {
            ScaWrd((GmfMshSct *)InpIdx,&a);
          }
          else {
            iVar4 = __isoc99_fscanf(*(undefined8 *)(InpIdx + 0x300410),"%d",&a);
            if (iVar4 != 1) {
LAB_00109230:
              iVar4 = -1;
LAB_00109236:
              longjmp(local_158,iVar4);
            }
          }
          l = (int64_t)a;
        }
        else {
          if ((*(uint *)(InpIdx + 0xc) & 1) == 0) {
            ScaDblWrd((GmfMshSct *)InpIdx,&l);
          }
          else {
            iVar4 = __isoc99_fscanf(*(undefined8 *)(InpIdx + 0x300410),"%ld",&l);
            if (iVar4 != 1) goto LAB_00109230;
          }
          a = (int)l;
        }
        if ((uVar8 == *(int *)(lVar1 + 0x11c) - 1) && (GmfMaxRefTab[local_140] < a)) {
          GmfMaxRefTab[local_140] = a;
        }
        if (*(int *)(OutIdx + 4) < 4) {
          if ((*(uint *)(OutIdx + 0xc) & 1) == 0) {
            wrd = (float *)&a;
LAB_00109187:
            RecWrd((GmfMshSct *)OutIdx,wrd);
          }
          else {
            fprintf(*(FILE **)(OutIdx + 0x300410),"%d ");
          }
        }
        else {
          if ((*(uint *)(OutIdx + 0xc) & 1) != 0) {
            pFVar7 = *(FILE **)(OutIdx + 0x300410);
            __format = "%ld ";
            pcVar6 = (char *)l;
            goto LAB_001091cb;
          }
          wrd_00 = (double *)&l;
LAB_0010919a:
          RecDblWrd((GmfMshSct *)OutIdx,wrd_00);
        }
      }
      else if (cVar2 == 'r') {
        if (*(int *)(InpIdx + 0x18) == 0x20) {
          if ((*(uint *)(InpIdx + 0xc) & 1) == 0) {
            ScaWrd((GmfMshSct *)InpIdx,&f);
          }
          else {
            iVar4 = __isoc99_fscanf(*(undefined8 *)(InpIdx + 0x300410),"%f",&f);
            if (iVar4 != 1) goto LAB_00109230;
          }
          d = (double)f;
        }
        else {
          if ((*(uint *)(InpIdx + 0xc) & 1) == 0) {
            ScaDblWrd((GmfMshSct *)InpIdx,&d);
          }
          else {
            iVar4 = __isoc99_fscanf(*(undefined8 *)(InpIdx + 0x300410),"%lf",&d);
            if (iVar4 != 1) goto LAB_00109230;
          }
          f = (float)d;
        }
        if (*(int *)(OutIdx + 0x18) == 0x20) {
          if ((*(uint *)(OutIdx + 0xc) & 1) == 0) {
            wrd = &f;
            goto LAB_00109187;
          }
          pFVar7 = *(FILE **)(OutIdx + 0x300410);
          pcVar6 = "%.9g ";
          dVar9 = (double)f;
        }
        else {
          if ((*(uint *)(OutIdx + 0xc) & 1) == 0) {
            wrd_00 = &d;
            goto LAB_0010919a;
          }
          pFVar7 = *(FILE **)(OutIdx + 0x300410);
          pcVar6 = "%.17g ";
          dVar9 = d;
        }
        fprintf(pFVar7,pcVar6,dVar9);
      }
    }
    iVar4 = 1;
    if ((*(byte *)(OutIdx + 0xc) & 1) != 0) {
      fputc(10,*(FILE **)(OutIdx + 0x300410));
    }
  }
  return iVar4;
}

Assistant:

int GmfCpyLin(int64_t InpIdx, int64_t OutIdx, int KwdCod)
{
   char        s[ WrdSiz * FilStrSiz ];
   double      d;
   float       f;
   int         i, a, err;
   int64_t     l;
   GmfMshSct   *InpMsh = (GmfMshSct *)InpIdx, *OutMsh = (GmfMshSct *)OutIdx;
   KwdSct      *kwd = &InpMsh->KwdTab[ KwdCod ];

   // Save the current stack environment for longjmp
   if( (err = setjmp(InpMsh->err)) != 0)
   {
#ifdef GMFDEBUG
      printf("libMeshb : mesh %p : error %d\n", InpMsh, err);
#endif
      return(0);
   }

   for(i=0;i<kwd->SolSiz;i++)
   {
      if(kwd->fmt[i] == 'r')
      {
         if(InpMsh->FltSiz == 32)
         {
            if(InpMsh->typ & Asc)
               safe_fscanf(InpMsh->hdl, "%f", &f, InpMsh->err);
            else
               ScaWrd(InpMsh, (unsigned char *)&f);

            d = (double)f;
         }
         else
         {
            if(InpMsh->typ & Asc)
               safe_fscanf(InpMsh->hdl, "%lf", &d, InpMsh->err);
            else
               ScaDblWrd(InpMsh, (unsigned char *)&d);

            f = (float)d;
         }

         if(OutMsh->FltSiz == 32)
            if(OutMsh->typ & Asc)
               fprintf(OutMsh->hdl, "%.9g ", (double)f);
            else
               RecWrd(OutMsh, (unsigned char *)&f);
         else
            if(OutMsh->typ & Asc)
               fprintf(OutMsh->hdl, "%.17g ", d);
            else
               RecDblWrd(OutMsh, (unsigned char *)&d);
      }
      else if(kwd->fmt[i] == 'i')
      {
         if(InpMsh->ver <= 3)
         {
            if(InpMsh->typ & Asc)
               safe_fscanf(InpMsh->hdl, "%d", &a, InpMsh->err);
            else
               ScaWrd(InpMsh, (unsigned char *)&a);

            l = (int64_t)a;
         }
         else
         {
            if(InpMsh->typ & Asc)
               safe_fscanf(InpMsh->hdl, INT64_T_FMT, &l, InpMsh->err);
            else
               ScaDblWrd(InpMsh, (unsigned char *)&l);

            a = (int)l;
         }

         if( (i == kwd->SolSiz-1) && (a > GmfMaxRefTab[ KwdCod ]) )
            GmfMaxRefTab[ KwdCod ] = a;

         if(OutMsh->ver <= 3)
         {
            if(OutMsh->typ & Asc)
               fprintf(OutMsh->hdl, "%d ", a);
            else
               RecWrd(OutMsh, (unsigned char *)&a);
         }
         else
         {
            if(OutMsh->typ & Asc)
               fprintf(OutMsh->hdl, INT64_T_FMT" ", l);
            else
               RecDblWrd(OutMsh, (unsigned char *)&l);
         }
      }
      else if(kwd->fmt[i] == 'c')
      {
         memset(s, 0, FilStrSiz * WrdSiz);

         if(InpMsh->typ & Asc)
         {
            //safe_fgets(s, WrdSiz * FilStrSiz, InpMsh->hdl, InpMsh->err);
            safe_fscanf(InpMsh->hdl, "%s", s, InpMsh->err);
         }
         else
#ifdef WITH_GMF_AIO
            read(InpMsh->FilDes, s, WrdSiz * FilStrSiz);
#else
            safe_fread(s, WrdSiz, FilStrSiz, InpMsh->hdl, InpMsh->err);
#endif
         if(OutMsh->typ & Asc)
            fprintf(OutMsh->hdl, "%s ", s);
         else
#ifdef WITH_GMF_AIO
            write(OutMsh->FilDes, s, WrdSiz * FilStrSiz);
#else
            fwrite(s, WrdSiz, FilStrSiz, OutMsh->hdl);
#endif
      }
   }

   if(OutMsh->typ & Asc)
      fprintf(OutMsh->hdl, "\n");

   return(1);
}